

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void __thiscall TxConfirmStats::ClearCurrent(TxConfirmStats *this,uint nBlockHeight)

{
  int *piVar1;
  long lVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer piVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pdVar3 = (this->buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (this->buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar5 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  piVar7 = (this->oldUnconfTxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar9 = 0; uVar10 = (ulong)uVar9, uVar10 < (ulong)((long)pdVar3 - (long)pdVar4 >> 3);
      uVar9 = uVar9 + 1) {
    lVar8 = *(long *)&pvVar5[(ulong)nBlockHeight % (ulong)(((long)pvVar6 - (long)pvVar5) / 0x18)].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data;
    piVar1 = piVar7 + uVar10;
    *piVar1 = *piVar1 + *(int *)(lVar8 + uVar10 * 4);
    *(undefined4 *)(lVar8 + uVar10 * 4) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::ClearCurrent(unsigned int nBlockHeight)
{
    for (unsigned int j = 0; j < buckets.size(); j++) {
        oldUnconfTxs[j] += unconfTxs[nBlockHeight % unconfTxs.size()][j];
        unconfTxs[nBlockHeight%unconfTxs.size()][j] = 0;
    }
}